

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall kratos::Generator::wire(Generator *this,Var *left,Var *right)

{
  undefined1 local_40 [32];
  Var *local_20;
  Var *right_local;
  Var *left_local;
  Generator *this_local;
  
  local_20 = right;
  right_local = left;
  left_local = (Var *)this;
  Var::assign((Var *)local_40,left);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_40 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_40);
  add_stmt(this,(shared_ptr<kratos::Stmt> *)(local_40 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_40 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_40);
  return;
}

Assistant:

void Generator::wire(Var &left, Var &right) { add_stmt(left.assign(right)); }